

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

Curl_addrinfo * Curl_resolver_getaddrinfo(Curl_easy *data,char *hostname,int port,int *waitp)

{
  time_t *ptVar1;
  _Bool _Var2;
  curltime cVar3;
  undefined4 uStack_74;
  resdata *reslv;
  undefined1 local_60 [4];
  int pf;
  addrinfo hints;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  reslv._4_4_ = 2;
  ptVar1 = (time_t *)(data->state).async.resolver;
  *waitp = 0;
  hints.ai_next = (addrinfo *)waitp;
  if ((data->conn->ip_version != '\x01') && (_Var2 = Curl_ipv6works(data), _Var2)) {
    if (data->conn->ip_version == '\x02') {
      reslv._4_4_ = 10;
    }
    else {
      reslv._4_4_ = 0;
    }
  }
  memset(local_60,0,0x30);
  pf = reslv._4_4_;
  hints.ai_flags = 2;
  if (data->conn->transport == '\x03') {
    hints.ai_flags = 1;
  }
  cVar3 = Curl_now();
  *ptVar1 = cVar3.tv_sec;
  ptVar1[1] = CONCAT44(uStack_74,cVar3.tv_usec);
  _Var2 = init_resolve_thread(data,hostname,port,(addrinfo *)local_60);
  if (_Var2) {
    (hints.ai_next)->ai_flags = 1;
  }
  else {
    Curl_failf(data,"getaddrinfo() thread failed to start");
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_resolver_getaddrinfo(struct Curl_easy *data,
                                                const char *hostname,
                                                int port,
                                                int *waitp)
{
  struct addrinfo hints;
  int pf = PF_INET;
  struct resdata *reslv = (struct resdata *)data->state.async.resolver;

  *waitp = 0; /* default to synchronous response */

#ifdef CURLRES_IPV6
  if((data->conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data)) {
    /* The stack seems to be IPv6-enabled */
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
    else
      pf = PF_UNSPEC;
  }
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = (data->conn->transport == TRNSPRT_TCP)?
    SOCK_STREAM : SOCK_DGRAM;

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(data, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start");
  return NULL;

}